

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_delete.cpp
# Opt level: O2

unique_ptr<duckdb::GlobalSinkState,_std::default_delete<duckdb::GlobalSinkState>,_true> __thiscall
duckdb::PhysicalDelete::GetGlobalSinkState(PhysicalDelete *this,ClientContext *context)

{
  _func_int **in_RAX;
  ClientContext *in_RDX;
  _func_int **local_18;
  
  local_18 = in_RAX;
  make_uniq<duckdb::DeleteGlobalState,duckdb::ClientContext&,duckdb::vector<duckdb::LogicalType,true>const&,duckdb::TableCatalogEntry&,duckdb::vector<duckdb::unique_ptr<duckdb::BoundConstraint,std::default_delete<duckdb::BoundConstraint>,true>,true>const&>
            ((duckdb *)&local_18,in_RDX,
             (vector<duckdb::LogicalType,_true> *)&context->registered_state,
             (TableCatalogEntry *)(context->config).profiler_settings._M_h._M_buckets,
             (vector<duckdb::unique_ptr<duckdb::BoundConstraint,_std::default_delete<duckdb::BoundConstraint>,_true>,_true>
              *)&(context->config).profiler_settings._M_h._M_before_begin);
  (this->super_PhysicalOperator)._vptr_PhysicalOperator = local_18;
  return (unique_ptr<duckdb::GlobalSinkState,_std::default_delete<duckdb::GlobalSinkState>_>)
         (unique_ptr<duckdb::GlobalSinkState,_std::default_delete<duckdb::GlobalSinkState>_>)this;
}

Assistant:

unique_ptr<GlobalSinkState> PhysicalDelete::GetGlobalSinkState(ClientContext &context) const {
	return make_uniq<DeleteGlobalState>(context, GetTypes(), tableref, bound_constraints);
}